

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_Look(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar5;
  AActor *pAVar6;
  FSoundID *sound_id;
  AActor *this;
  char *__assertion;
  bool bVar7;
  float attenuation;
  NActorIterator iterator;
  FSoundID local_34;
  FSoundID local_30;
  FName local_2c;
  NActorIterator local_28;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003f474f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f473f:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f474f:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x79e,"int AF_AActor_A_Look(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_003f4436;
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f474f;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_003f473f;
LAB_003f4436:
    this = (AActor *)0x0;
  }
  if (((this->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    local_28.super_FActorIterator.id = this->args[1];
    local_28.super_FActorIterator.base = (AActor *)0x0;
    local_2c.Index = 0x111;
    local_28.type = PClass::FindClass(&local_2c);
    this->special = 0;
    pAVar4 = NActorIterator::Next(&local_28);
    (this->goal).field_0.p = pAVar4;
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    (this->flags5).Value = (uint)(this->args[3] != 0) << 7 | (this->flags5).Value & 0xffffff7f;
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if (((i_compatflags._1_1_ & 8) == 0) && (((this->flags).Value & 8) == 0)) {
      paVar5 = &(this->LastHeard).field_0;
    }
    else {
      paVar5 = &(this->Sector->SoundTarget).field_0;
    }
    pAVar4 = paVar5->p;
    if (pAVar4 != (AActor *)0x0) {
      if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) goto LAB_003f4567;
      if (0 < pAVar4->health) {
        if ((pAVar4->player != (player_t *)0x0) && ((pAVar4->player->cheats & 8) != 0)) {
          return 0;
        }
        goto LAB_003f4571;
      }
    }
LAB_003f456e:
    pAVar4 = (AActor *)0x0;
  }
  else {
    pAVar4 = (this->target).field_0.p;
    if (pAVar4 == (AActor *)0x0) goto LAB_003f456e;
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      paVar5 = &(this->target).field_0;
LAB_003f4567:
      *paVar5 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
      goto LAB_003f456e;
    }
  }
LAB_003f4571:
  if (((this->flags).Value & 0x40000000) != 0) {
    this->visdir = -1;
  }
  if ((pAVar4 == (AActor *)0x0) || (((pAVar4->flags).Value & 4) == 0)) {
LAB_003f4594:
    bVar7 = P_LookForPlayers(this,(this->flags4).Value & 0x10000,(FLookExParams *)0x0);
    if (!bVar7) {
      return 0;
    }
  }
  else {
    bVar7 = AActor::IsFriend(this,pAVar4);
    if (bVar7) {
      bVar7 = P_LookForPlayers(this,(this->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (!bVar7) {
        if (this->SeeState == (FState *)0x0) {
          A_Wander(this,0);
        }
        else {
          AActor::SetState(this,this->SeeState,false);
        }
        goto LAB_003f4594;
      }
    }
    else {
      (this->target).field_0.p = pAVar4;
      if (((this->flags).Value & 0x20) != 0) {
        if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
          (this->target).field_0.p = (AActor *)0x0;
          pAVar4 = (AActor *)0x0;
        }
        bVar7 = P_CheckSight(this,pAVar4,4);
        if (!bVar7) goto LAB_003f4594;
      }
    }
  }
  pAVar4 = (this->goal).field_0.p;
  if (pAVar4 == (AActor *)0x0) {
LAB_003f45ce:
    pAVar4 = (AActor *)0x0;
  }
  else if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->goal).field_0.p = (AActor *)0x0;
    goto LAB_003f45ce;
  }
  pAVar6 = (this->target).field_0.p;
  if (pAVar6 == (AActor *)0x0) {
LAB_003f45ed:
    pAVar6 = (AActor *)0x0;
  }
  else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->target).field_0.p = (AActor *)0x0;
    goto LAB_003f45ed;
  }
  if (pAVar6 == pAVar4) {
    if (level.maptime < this->reactiontime) goto LAB_003f471e;
  }
  else {
    iVar2 = (this->SeeSound).super_FSoundID.ID;
    if (iVar2 != 0) {
      if (((this->flags2).Value & 0x8000) == 0) {
        sound_id = &local_34;
        attenuation = 1.0;
        local_34.ID = iVar2;
      }
      else {
        sound_id = &local_30;
        attenuation = 0.0;
        local_30.ID = iVar2;
      }
      S_Sound(this,2,sound_id,1.0,attenuation);
    }
  }
  pAVar4 = (this->target).field_0.p;
  if (pAVar4 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
    AActor::SetState(this,this->SeeState,false);
    return 0;
  }
LAB_003f471e:
  (this->target).field_0.p = (AActor *)0x0;
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look)
{
	PARAM_SELF_PROLOGUE(AActor);

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator (NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0) self->flags5 &= ~MF5_CHASEGOAL;
		else self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)? 
			self->Sector->SoundTarget : self->LastHeard;

		// [RH] If the soundtarget is dead, don't chase it
		if (targ != NULL && targ->health <= 0)
		{
			targ = NULL;
		}

		if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
		{
			return 0;
		}
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			// If we find a valid target here, the wandering logic should *not*
			// be activated! It would cause the seestate to be set twice.
			if (P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto seeyou;

			// Let the self wander around aimlessly looking for a fight
			if (self->SeeState != NULL)
			{
				self->SetState (self->SeeState);
			}
			else
			{
				A_Wander(self);
			}
		}
		else
		{
			self->target = targ;

			if (self->flags & MF_AMBUSH)
			{
				if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING))
					goto seeyou;
			}
			else
				goto seeyou;
		}
	}
	
	if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
		return 0;
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound)
	{
		if (self->flags2 & MF2_BOSS)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target)
	{
		self->SetState (self->SeeState);
	}
	return 0;
}